

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::String,kj::FixedArray<char,1ul>>
                 (char *target,String *first,FixedArray<char,_1UL> *rest)

{
  char *pcVar1;
  FixedArray<char,_1UL> *first_00;
  char *end;
  char *i;
  FixedArray<char,_1UL> *rest_local;
  String *first_local;
  char *target_local;
  
  end = String::begin(first);
  pcVar1 = String::end(first);
  first_local = (String *)target;
  while (end != pcVar1) {
    *(char *)&(first_local->content).ptr = *end;
    end = end + 1;
    first_local = (String *)((long)&(first_local->content).ptr + 1);
  }
  first_00 = fwd<kj::FixedArray<char,1ul>>(rest);
  pcVar1 = fill<kj::FixedArray<char,1ul>>((char *)first_local,first_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}